

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

Int __thiscall Json::Value::asInt(Value *this)

{
  bool bVar1;
  double *in_RDI;
  ostringstream oss_3;
  ostringstream oss_2;
  ostringstream oss_1;
  ostringstream oss;
  Value *in_stack_fffffffffffff958;
  ostringstream *this_00;
  string *in_stack_fffffffffffff960;
  string *msg;
  string local_680 [32];
  ostringstream local_660 [376];
  string local_4e8 [32];
  ostringstream local_4c8 [376];
  string local_350 [32];
  string local_330 [11];
  string local_1b8 [48];
  ostringstream local_188 [388];
  uint local_4;
  
  switch(*(undefined1 *)(in_RDI + 1)) {
  case 0:
    local_4 = 0;
    break;
  case 1:
    bVar1 = isInt(in_stack_fffffffffffff958);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream(local_188);
      std::operator<<((ostream *)local_188,"LargestInt out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError(in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_1b8);
      abort();
    }
    local_4 = SUB84(*in_RDI,0);
    break;
  case 2:
    bVar1 = isInt(in_stack_fffffffffffff958);
    if (!bVar1) {
      msg = local_330;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)msg);
      std::operator<<((ostream *)msg,"LargestUInt out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError(msg);
      std::__cxx11::string::~string(local_350);
      abort();
    }
    local_4 = SUB84(*in_RDI,0);
    break;
  case 3:
    bVar1 = InRange<int,int>(*in_RDI,-0x80000000,0x7fffffff);
    if (!bVar1) {
      this_00 = local_4c8;
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"double out of Int range");
      std::__cxx11::ostringstream::str();
      throwLogicError(in_stack_fffffffffffff960);
      std::__cxx11::string::~string(local_4e8);
      abort();
    }
    local_4 = (uint)*in_RDI;
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_660);
    std::operator<<((ostream *)local_660,"Value is not convertible to Int.");
    std::__cxx11::ostringstream::str();
    throwLogicError(in_stack_fffffffffffff960);
    std::__cxx11::string::~string(local_680);
    abort();
  case 5:
    local_4 = (uint)(((ulong)*in_RDI & 1) != 0);
  }
  return local_4;
}

Assistant:

Value::Int Value::asInt() const {
  switch (type_) {
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}